

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O0

SshChannel * ssh2_serverside_x11_open(ConnectionLayer *cl,Channel *chan,SocketPeerInfo *pi)

{
  LogContext *ctx;
  ssh2_channel *c_00;
  char *event;
  PktOut *pPVar1;
  int local_64;
  char *local_58;
  PktOut *pktout;
  ssh2_channel *c;
  PacketProtocolLayer *ppl;
  ssh2_connection_state *s;
  SocketPeerInfo *pi_local;
  Channel *chan_local;
  ConnectionLayer *cl_local;
  
  c_00 = (ssh2_channel *)safemalloc(1,0xc0,0);
  c_00->connlayer = (ssh2_connection_state *)&cl[-0xe].vt;
  ssh2_channel_init(c_00);
  c_00->halfopen = true;
  c_00->chan = chan;
  ctx = cl[5].logctx;
  event = dupprintf("Forwarding X11 channel to client");
  logevent_and_free(ctx,event);
  pPVar1 = ssh2_chanopen_init(c_00,"x11");
  if ((pi == (SocketPeerInfo *)0x0) || (pi->addr_text == (char *)0x0)) {
    local_58 = "0.0.0.0";
  }
  else {
    local_58 = pi->addr_text;
  }
  BinarySink_put_stringz(pPVar1->binarysink_,local_58);
  if ((pi == (SocketPeerInfo *)0x0) || (pi->port < 0)) {
    local_64 = 0;
  }
  else {
    local_64 = pi->port;
  }
  BinarySink_put_uint32(pPVar1->binarysink_,(long)local_64);
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar1->qnode);
  return &c_00->sc;
}

Assistant:

SshChannel *ssh2_serverside_x11_open(
    ConnectionLayer *cl, Channel *chan, const SocketPeerInfo *pi)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh2_channel *c = snew(struct ssh2_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh2_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    ppl_logevent("Forwarding X11 channel to client");

    pktout = ssh2_chanopen_init(c, "x11");
    put_stringz(pktout, (pi && pi->addr_text ? pi->addr_text : "0.0.0.0"));
    put_uint32(pktout, (pi && pi->port >= 0 ? pi->port : 0));
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}